

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O3

void next_line(fe_state *s)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = s->size;
  if (0 < iVar2) {
    pcVar1 = s->data;
    if (*pcVar1 == '\r') {
      s->data = pcVar1 + 1;
      s->size = iVar2 + -1;
      if ((iVar2 == 1) || (pcVar1[1] != '\n')) goto LAB_00110546;
      s->data = pcVar1 + 2;
      iVar2 = iVar2 + -2;
    }
    else {
      if (*pcVar1 != '\n') goto LAB_00110546;
      s->data = pcVar1 + 1;
      iVar2 = iVar2 + -1;
    }
    s->size = iVar2;
    return;
  }
LAB_00110546:
  s->error = true;
  return;
}

Assistant:

static void next_line(fe_state &s)
{
    if (s.size <= 0)
    {
        s.error = true;
        return;
    }
    if (*s.data == '\n')
    {
        s.data++;
        s.size--;
        return;
    }



    if (*s.data == '\r')
    {
        s.data++;
        s.size--;

        if (s.size <= 0)
        {
            s.error = true;
            return;
        }

        if (*s.data == '\n')
        {
            s.data++;
            s.size--;
            return;
        }
    }

    s.error = true;
}